

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O2

void brotli::ClusterHistograms<brotli::Histogram<704>>
               (vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *in,
               size_t num_contexts,size_t num_blocks,size_t max_histograms,
               vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *out,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *histogram_symbols)

{
  size_t symbols_size;
  ulong __n;
  size_t i_1;
  long lVar1;
  ulong uVar2;
  size_t i;
  long lVar3;
  ulong uVar4;
  double dVar5;
  allocator_type local_61;
  size_t local_60;
  vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_> *local_58;
  value_type_conflict local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cluster_size;
  
  __n = num_contexts * num_blocks;
  local_60 = max_histograms;
  if (__n - ((long)(in->
                   super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
            (long)(in->
                  super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                  )._M_impl.super__Vector_impl_data._M_start) / 0xb10 == 0) {
    local_4c = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&cluster_size,__n,&local_4c,&local_61);
    std::vector<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>::resize(out,__n);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(histogram_symbols,__n);
    lVar1 = 0;
    for (lVar3 = 0; __n - lVar3 != 0; lVar3 = lVar3 + 1) {
      memcpy((void *)((long)((out->
                             super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->data_ + lVar1),
             (void *)((long)((in->
                             super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->data_ + lVar1),0xb10);
      dVar5 = PopulationCost<704>((Histogram<704> *)
                                  ((long)((in->
                                          super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->data_ + lVar1
                                  ));
      *(double *)
       ((long)&((out->
                super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                )._M_impl.super__Vector_impl_data._M_start)->bit_cost_ + lVar1) = dVar5;
      (histogram_symbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar3] = (uint)lVar3;
      lVar1 = lVar1 + 0xb10;
    }
    lVar1 = 0;
    uVar4 = __n;
    local_58 = in;
    for (uVar2 = 0; uVar2 < __n; uVar2 = uVar2 + 0x40) {
      symbols_size = 0x40;
      if (uVar4 < 0x40) {
        symbols_size = uVar4;
      }
      HistogramCombine<brotli::Histogram<704>>
                ((out->
                 super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 cluster_size.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (uint32_t *)
                 ((long)(histogram_symbols->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar1),symbols_size,local_60);
      lVar1 = lVar1 + 0x100;
      uVar4 = uVar4 - 0x40;
    }
    HistogramCombine<brotli::Histogram<704>>
              ((out->
               super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>)
               ._M_impl.super__Vector_impl_data._M_start,
               cluster_size.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (histogram_symbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start,__n,local_60);
    HistogramRemap<brotli::Histogram<704>>
              ((local_58->
               super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>)
               ._M_impl.super__Vector_impl_data._M_start,__n,
               (out->
               super__Vector_base<brotli::Histogram<704>,_std::allocator<brotli::Histogram<704>_>_>)
               ._M_impl.super__Vector_impl_data._M_start,
               (histogram_symbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start);
    HistogramReindex<brotli::Histogram<704>>(out,histogram_symbols);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&cluster_size.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return;
  }
  __assert_fail("in_size == in.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/./cluster.h"
                ,0x106,
                "void brotli::ClusterHistograms(const std::vector<HistogramType> &, size_t, size_t, size_t, std::vector<HistogramType> *, std::vector<uint32_t> *) [HistogramType = brotli::Histogram<704>]"
               );
}

Assistant:

void ClusterHistograms(const std::vector<HistogramType>& in,
                       size_t num_contexts, size_t num_blocks,
                       size_t max_histograms,
                       std::vector<HistogramType>* out,
                       std::vector<uint32_t>* histogram_symbols) {
  const size_t in_size = num_contexts * num_blocks;
  assert(in_size == in.size());
  std::vector<uint32_t> cluster_size(in_size, 1);
  out->resize(in_size);
  histogram_symbols->resize(in_size);
  for (size_t i = 0; i < in_size; ++i) {
    (*out)[i] = in[i];
    (*out)[i].bit_cost_ = PopulationCost(in[i]);
    (*histogram_symbols)[i] = static_cast<uint32_t>(i);
  }


  const size_t max_input_histograms = 64;
  for (size_t i = 0; i < in_size; i += max_input_histograms) {
    size_t num_to_combine = std::min(in_size - i, max_input_histograms);
    HistogramCombine(&(*out)[0], &cluster_size[0],
                     &(*histogram_symbols)[i], num_to_combine,
                     max_histograms);
  }

  // Collapse similar histograms.
  HistogramCombine(&(*out)[0], &cluster_size[0],
                   &(*histogram_symbols)[0], in_size,
                   max_histograms);

  // Find the optimal map from original histograms to the final ones.
  HistogramRemap(&in[0], in_size, &(*out)[0], &(*histogram_symbols)[0]);

  // Convert the context map to a canonical form.
  HistogramReindex(out, histogram_symbols);

}